

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_imagetype(FeatureType *this)

{
  bool bVar1;
  ImageFeatureType *this_00;
  FeatureType *this_local;
  
  bVar1 = has_imagetype(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_imagetype(this);
    this_00 = (ImageFeatureType *)operator_new(0x38);
    ImageFeatureType::ImageFeatureType(this_00);
    (this->Type_).imagetype_ = this_00;
  }
  return (ImageFeatureType *)(this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType* FeatureType::mutable_imagetype() {
  if (!has_imagetype()) {
    clear_Type();
    set_has_imagetype();
    Type_.imagetype_ = new ::CoreML::Specification::ImageFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.imageType)
  return Type_.imagetype_;
}